

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O1

void do_commands(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  short *psVar6;
  int iVar7;
  char *pcVar8;
  char buf [4608];
  char acStack_1238 [4616];
  
  psVar6 = &cmd_table[0].level;
  pcVar8 = "north";
  iVar7 = 0;
  bVar3 = 0;
  do {
    sVar1 = *psVar6;
    if (sVar1 < 0x33) {
      iVar5 = get_trust(ch);
      if ((sVar1 <= iVar5) && (psVar6[2] != 0)) {
        sprintf(acStack_1238,"%-12s",pcVar8);
        send_to_char(acStack_1238,ch);
        iVar5 = iVar7 * -0x55555555;
        iVar7 = iVar7 + 1;
        bVar4 = bVar3 + 1;
        bVar2 = bVar3 ^ 1;
        bVar3 = bVar4;
        if ((iVar5 + 0xd5555555U >> 1 | (uint)bVar2 << 0x1f) < 0x2aaaaaab) {
          send_to_char("\n\r",ch);
        }
      }
    }
    pcVar8 = *(char **)(psVar6 + 0xb);
    psVar6 = psVar6 + 0x14;
  } while (*pcVar8 != '\0');
  if (0x2aaaaaaa < (iVar7 * -0x55555555 + 0x2aaaaaaaU >> 1 | (uint)bVar3 << 0x1f)) {
    send_to_char("\n\r",ch);
  }
  return;
}

Assistant:

void do_commands(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	int cmd;
	int col;

	col = 0;

	for (cmd = 0; cmd_table[cmd].name[0] != '\0'; cmd++)
	{
		if (cmd_table[cmd].level < LEVEL_HERO && cmd_table[cmd].level <= get_trust(ch) && cmd_table[cmd].show)
		{
			sprintf(buf, "%-12s", cmd_table[cmd].name);
			send_to_char(buf, ch);

			if (++col % 6 == 0)
				send_to_char("\n\r", ch);
		}
	}

	if (col % 6 != 0)
		send_to_char("\n\r", ch);
}